

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O3

int mbedtls_x509write_crt_der
              (mbedtls_x509write_cert *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  char *oid;
  mbedtls_pk_type_t mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t oid_len;
  mbedtls_md_info_t *md_info;
  size_t *olen;
  mbedtls_pk_type_t pk_alg;
  size_t sVar5;
  uchar *c;
  size_t local_ce0;
  uchar *local_cd8;
  uchar *c2;
  uint local_cc4;
  uint local_cc0;
  uint local_cbc;
  uint local_cb8;
  uint local_cb4;
  uint local_cb0;
  uint local_cac;
  char *sig_oid;
  ulong local_ca0;
  ulong local_c98;
  ulong local_c90;
  size_t sig_len;
  size_t sig_oid_len;
  uchar hash [64];
  uchar tmp_buf [2048];
  uchar sig [1024];
  
  olen = &sig_oid_len;
  sig_oid_len = 0;
  c = sig;
  mVar1 = mbedtls_pk_get_type(ctx->issuer_key);
  pk_alg = MBEDTLS_PK_ECDSA;
  if (mVar1 != MBEDTLS_PK_ECKEY) {
    pk_alg = mVar1;
  }
  uVar2 = mbedtls_oid_get_oid_by_sig_alg(pk_alg,ctx->md_alg,&sig_oid,olen);
  if ((((uVar2 == 0) &&
       (local_cd8 = buf, uVar3 = mbedtls_x509_write_extensions(&c,tmp_buf,ctx->extensions),
       uVar2 = uVar3, -1 < (int)uVar3)) &&
      (uVar4 = mbedtls_asn1_write_len(&c,tmp_buf,(ulong)uVar3), uVar2 = uVar4, -1 < (int)uVar4)) &&
     (uVar2 = mbedtls_asn1_write_tag(&c,tmp_buf,'0'), -1 < (int)uVar2)) {
    sVar5 = (ulong)uVar2 + (ulong)(uVar4 + uVar3);
    uVar3 = mbedtls_asn1_write_len(&c,tmp_buf,sVar5);
    uVar2 = uVar3;
    if (-1 < (int)uVar3) {
      local_ce0 = sVar5;
      local_cac = mbedtls_asn1_write_tag(&c,tmp_buf,0xa3);
      uVar2 = local_cac;
      if ((-1 < (int)local_cac) &&
         (uVar4 = mbedtls_pk_write_pubkey_der(ctx->subject_key,tmp_buf,(long)c - (long)tmp_buf),
         uVar2 = uVar4, -1 < (int)uVar4)) {
        c = c + -(ulong)uVar4;
        local_cb0 = mbedtls_x509_write_names(&c,tmp_buf,ctx->subject);
        uVar2 = local_cb0;
        if ((-1 < (int)local_cb0) &&
           ((local_c90 = (ulong)uVar4,
            uVar4 = x509_write_time(&c,tmp_buf,ctx->not_after,(size_t)olen), uVar2 = uVar4,
            -1 < (int)uVar4 &&
            (uVar2 = x509_write_time(&c,tmp_buf,ctx->not_before,(size_t)olen), -1 < (int)uVar2)))) {
          local_c98 = (ulong)(uVar2 + uVar4);
          uVar4 = mbedtls_asn1_write_len(&c,tmp_buf,local_c98);
          uVar2 = uVar4;
          if ((-1 < (int)uVar4) &&
             ((local_cb4 = mbedtls_asn1_write_tag(&c,tmp_buf,'0'), uVar2 = local_cb4,
              -1 < (int)local_cb4 &&
              (local_cbc = mbedtls_x509_write_names(&c,tmp_buf,ctx->issuer), oid = sig_oid,
              uVar2 = local_cbc, -1 < (int)local_cbc)))) {
            local_cb8 = uVar4;
            oid_len = strlen(sig_oid);
            uVar4 = mbedtls_asn1_write_algorithm_identifier(&c,tmp_buf,oid,oid_len,0);
            uVar2 = uVar4;
            if ((-1 < (int)uVar4) &&
               ((local_cc0 = mbedtls_asn1_write_mpi(&c,tmp_buf,&ctx->serial), uVar2 = local_cc0,
                -1 < (int)local_cc0 &&
                (uVar2 = mbedtls_asn1_write_int(&c,tmp_buf,ctx->version), -1 < (int)uVar2)))) {
              local_ca0 = (ulong)uVar2;
              local_cc4 = mbedtls_asn1_write_len(&c,tmp_buf,local_ca0);
              uVar2 = local_cc4;
              if ((-1 < (int)local_cc4) &&
                 (uVar2 = mbedtls_asn1_write_tag(&c,tmp_buf,0xa0), -1 < (int)uVar2)) {
                sVar5 = (ulong)uVar2 +
                        (ulong)local_cc4 +
                        (ulong)local_cc0 +
                        (ulong)uVar4 + (ulong)local_cbc + (ulong)local_cb4 + (ulong)local_cb8 +
                        local_ca0 +
                        (ulong)local_cb0 + local_ce0 + local_cac + local_c90 + (ulong)uVar3 +
                        local_c98;
                uVar3 = mbedtls_asn1_write_len(&c,tmp_buf,sVar5);
                uVar2 = uVar3;
                if ((-1 < (int)uVar3) &&
                   (uVar2 = mbedtls_asn1_write_tag(&c,tmp_buf,'0'), -1 < (int)uVar2)) {
                  sVar5 = sVar5 + uVar2 + (ulong)uVar3;
                  md_info = mbedtls_md_info_from_type(ctx->md_alg);
                  local_ce0 = sVar5;
                  mbedtls_md(md_info,c,sVar5,hash);
                  uVar2 = mbedtls_pk_sign(ctx->issuer_key,ctx->md_alg,hash,0,sig,&sig_len,f_rng,
                                          p_rng);
                  if (uVar2 == 0) {
                    c2 = local_cd8 + size;
                    uVar3 = mbedtls_x509_write_sig(&c2,local_cd8,sig_oid,sig_oid_len,sig,sig_len);
                    sVar5 = local_ce0;
                    uVar2 = uVar3;
                    if ((-1 < (int)uVar3) &&
                       (uVar2 = 0xffffff94, local_ce0 <= (ulong)((long)c2 - (long)local_cd8))) {
                      c2 = c2 + -local_ce0;
                      memcpy(c2,c,local_ce0);
                      uVar4 = mbedtls_asn1_write_len(&c2,local_cd8,uVar3 + sVar5);
                      uVar2 = uVar4;
                      if ((-1 < (int)uVar4) &&
                         (uVar2 = mbedtls_asn1_write_tag(&c2,local_cd8,'0'), -1 < (int)uVar2)) {
                        uVar2 = uVar4 + (int)(uVar3 + sVar5) + uVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_x509write_crt_der( mbedtls_x509write_cert *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    const char *sig_oid;
    size_t sig_oid_len = 0;
    unsigned char *c, *c2;
    unsigned char hash[64];
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char tmp_buf[2048];
    size_t sub_len = 0, pub_len = 0, sig_and_oid_len = 0, sig_len;
    size_t len = 0;
    mbedtls_pk_type_t pk_alg;

    /*
     * Prepare data to be signed in tmp_buf
     */
    c = tmp_buf + sizeof( tmp_buf );

    /* Signature algorithm needed in TBS, and later for actual signature */
    pk_alg = mbedtls_pk_get_type( ctx->issuer_key );
    if( pk_alg == MBEDTLS_PK_ECKEY )
        pk_alg = MBEDTLS_PK_ECDSA;

    if( ( ret = mbedtls_oid_get_oid_by_sig_alg( pk_alg, ctx->md_alg,
                                        &sig_oid, &sig_oid_len ) ) != 0 )
    {
        return( ret );
    }

    /*
     *  Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_extensions( &c, tmp_buf, ctx->extensions ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC |
                                                    MBEDTLS_ASN1_CONSTRUCTED | 3 ) );

    /*
     *  SubjectPublicKeyInfo
     */
    MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_pk_write_pubkey_der( ctx->subject_key,
                                                tmp_buf, c - tmp_buf ) );
    c -= pub_len;
    len += pub_len;

    /*
     *  Subject  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->subject ) );

    /*
     *  Validity ::= SEQUENCE {
     *       notBefore      Time,
     *       notAfter       Time }
     */
    sub_len = 0;

    MBEDTLS_ASN1_CHK_ADD( sub_len, x509_write_time( &c, tmp_buf, ctx->not_after,
                                            MBEDTLS_X509_RFC5280_UTC_TIME_LEN ) );

    MBEDTLS_ASN1_CHK_ADD( sub_len, x509_write_time( &c, tmp_buf, ctx->not_before,
                                            MBEDTLS_X509_RFC5280_UTC_TIME_LEN ) );

    len += sub_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, sub_len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     *  Issuer  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->issuer ) );

    /*
     *  Signature   ::=  AlgorithmIdentifier
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, tmp_buf,
                       sig_oid, strlen( sig_oid ), 0 ) );

    /*
     *  Serial   ::=  INTEGER
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, tmp_buf, &ctx->serial ) );

    /*
     *  Version  ::=  INTEGER  {  v1(0), v2(1), v3(2)  }
     */
    sub_len = 0;
    MBEDTLS_ASN1_CHK_ADD( sub_len, mbedtls_asn1_write_int( &c, tmp_buf, ctx->version ) );
    len += sub_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, sub_len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC |
                                                    MBEDTLS_ASN1_CONSTRUCTED | 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     * Make signature
     */
    mbedtls_md( mbedtls_md_info_from_type( ctx->md_alg ), c, len, hash );

    if( ( ret = mbedtls_pk_sign( ctx->issuer_key, ctx->md_alg, hash, 0, sig, &sig_len,
                         f_rng, p_rng ) ) != 0 )
    {
        return( ret );
    }

    /*
     * Write data to output buffer
     */
    c2 = buf + size;
    MBEDTLS_ASN1_CHK_ADD( sig_and_oid_len, mbedtls_x509_write_sig( &c2, buf,
                                        sig_oid, sig_oid_len, sig, sig_len ) );

    if( len > (size_t)( c2 - buf ) )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    c2 -= len;
    memcpy( c2, c, len );

    len += sig_and_oid_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c2, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c2, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}